

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O3

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *
cfd::api::json::TransactionJsonApi::ConvertFromLockingScript
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          AddressFactory *factory,Script *script,string *script_type,int64_t *require_num)

{
  pointer __dest;
  LockingScriptType script_type_00;
  pointer __x;
  ulong uVar1;
  size_t __n;
  ByteData160 hash;
  ExtractScriptData extract_data;
  Pubkey pubkey_1;
  Address address;
  Pubkey local_400;
  ByteData local_3e8;
  ExtractScriptData local_3c8;
  _func_int **local_398;
  ByteData *local_390;
  undefined1 local_388 [32];
  undefined1 local_368 [16];
  pointer local_358;
  pointer local_340;
  pointer local_328;
  TapBranch local_310;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_298;
  Script local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  ByteData local_210;
  Pubkey local_1f8;
  string *local_1e0 [2];
  string local_1d0;
  pointer local_1b0;
  pointer local_198;
  pointer local_180;
  TapBranch local_168;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_f0;
  Script local_d8;
  AddressFormatData local_98;
  Script local_68;
  
  core::Script::Script(&local_68,script);
  ExtractLockingScript(&local_3c8,&local_68);
  core::Script::~Script(&local_68);
  if (script_type != (string *)0x0) {
    local_1e0[0] = &((Address *)local_1e0)->address_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"nonstandard","");
    if (local_3c8.script_type != kFee) {
      ConvertLockingScriptTypeString_abi_cxx11_
                ((string *)local_388,(TransactionJsonApi *)(ulong)local_3c8.script_type,
                 script_type_00);
      std::__cxx11::string::operator=((string *)local_1e0,(string *)local_388);
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_);
      }
    }
    std::__cxx11::string::_M_assign((string *)script_type);
    if (local_1e0[0] != &((Address *)local_1e0)->address_) {
      operator_delete(local_1e0[0]);
    }
  }
  if (require_num != (int64_t *)0x0) {
    *require_num = ((long)local_3c8.pushed_datas.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_3c8.pushed_datas.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::Address::Address((Address *)local_1e0);
  switch(local_3c8.script_type) {
  case kPayToPubkey:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_210,
               &(local_3c8.pushed_datas.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data_);
    core::Pubkey::Pubkey(&local_400,&local_210);
    if (local_210.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    AddressFactory::CreateP2pkhAddress((Address *)local_388,factory,&local_400);
    core::Address::operator=((Address *)local_1e0,(Address *)local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_240);
    core::Script::~Script(&local_280);
    local_310._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_298);
    core::TapBranch::~TapBranch(&local_310);
    if (local_328 != (pointer)0x0) {
      operator_delete(local_328);
    }
    if (local_340 != (pointer)0x0) {
      operator_delete(local_340);
    }
    if (local_358 != (pointer)0x0) {
      operator_delete(local_358);
    }
    if ((undefined1 *)local_388._16_8_ != local_368) {
      operator_delete((void *)local_388._16_8_);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1e0);
    goto LAB_00462396;
  case kPayToPubkeyHash:
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
               local_3c8.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    core::ByteData160::ByteData160
              ((ByteData160 *)&local_400,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_);
    }
    AddressFactory::GetAddressByHash
              ((Address *)local_388,factory,kP2pkhAddress,(ByteData160 *)&local_400);
    core::Address::operator=((Address *)local_1e0,(Address *)local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_240);
    core::Script::~Script(&local_280);
    local_310._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_298);
    core::TapBranch::~TapBranch(&local_310);
    if (local_328 != (pointer)0x0) {
      operator_delete(local_328);
    }
    if (local_340 != (pointer)0x0) {
      operator_delete(local_340);
    }
    if (local_358 != (pointer)0x0) {
      operator_delete(local_358);
    }
    if ((undefined1 *)local_388._16_8_ != local_368) {
      operator_delete((void *)local_388._16_8_);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1e0);
    goto LAB_00462396;
  case kPayToScriptHash:
    core::ByteData::GetBytes
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388,
               local_3c8.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    core::ByteData160::ByteData160
              ((ByteData160 *)&local_400,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_);
    }
    AddressFactory::GetAddressByHash
              ((Address *)local_388,factory,kP2shAddress,(ByteData160 *)&local_400);
    core::Address::operator=((Address *)local_1e0,(Address *)local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_240);
    core::Script::~Script(&local_280);
    local_310._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_298);
    core::TapBranch::~TapBranch(&local_310);
    if (local_328 != (pointer)0x0) {
      operator_delete(local_328);
    }
    if (local_340 != (pointer)0x0) {
      operator_delete(local_340);
    }
    if (local_358 != (pointer)0x0) {
      operator_delete(local_358);
    }
    if ((undefined1 *)local_388._16_8_ != local_368) {
      operator_delete((void *)local_388._16_8_);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1e0);
LAB_00462396:
    if (local_400.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_400.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    break;
  case kMultisig:
    if (require_num != (int64_t *)0x0) {
      *require_num = local_3c8.req_sigs;
    }
    local_390 = local_3c8.pushed_datas.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_3c8.pushed_datas.
        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_3c8.pushed_datas.
        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_398 = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
      __x = local_3c8.pushed_datas.
            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
            super__Vector_impl_data._M_start;
      do {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_400,&__x->data_);
        local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar1 = (long)local_400.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_400.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (uVar1 == 0) {
          __dest = (pointer)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar1 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (pointer)operator_new(uVar1);
          __n = (long)local_400.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_400.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __dest + uVar1;
        local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = __dest;
        if (local_400.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_400.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = __dest;
          memmove(__dest,local_400.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,__n);
        }
        local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest + __n;
        core::Pubkey::Pubkey(&local_1f8,&local_3e8);
        if (local_3e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        AddressFactory::CreateP2pkhAddress((Address *)local_388,factory,&local_1f8);
        core::Address::operator=((Address *)local_1e0,(Address *)local_388);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_240);
        core::Script::~Script(&local_280);
        local_310._vptr_TapBranch = local_398;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_298);
        core::TapBranch::~TapBranch(&local_310);
        if (local_328 != (pointer)0x0) {
          operator_delete(local_328);
        }
        if (local_340 != (pointer)0x0) {
          operator_delete(local_340);
        }
        if (local_358 != (pointer)0x0) {
          operator_delete(local_358);
        }
        if ((undefined1 *)local_388._16_8_ != local_368) {
          operator_delete((void *)local_388._16_8_);
        }
        std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
                  (__return_storage_ptr__,(Address *)local_1e0);
        if (local_1f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_400.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_400.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        __x = __x + 1;
      } while (__x != local_390);
    }
    break;
  case kWitnessV0ScriptHash:
  case kWitnessV0KeyHash:
  case kWitnessV1Taproot:
    AddressFactory::GetSegwitAddressByHash
              ((Address *)local_388,factory,
               local_3c8.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start,local_3c8.witness_version);
    core::Address::operator=((Address *)local_1e0,(Address *)local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_240);
    core::Script::~Script(&local_280);
    local_310._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_298);
    core::TapBranch::~TapBranch(&local_310);
    if (local_328 != (pointer)0x0) {
      operator_delete(local_328);
    }
    if (local_340 != (pointer)0x0) {
      operator_delete(local_340);
    }
    if (local_358 != (pointer)0x0) {
      operator_delete(local_358);
    }
    if ((undefined1 *)local_388._16_8_ != local_368) {
      operator_delete((void *)local_388._16_8_);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1e0);
    break;
  case kWitnessUnknown:
    AddressFactory::GetSegwitAddressByHash
              ((Address *)local_388,factory,
               local_3c8.pushed_datas.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start,local_3c8.witness_version);
    core::Address::operator=((Address *)local_1e0,(Address *)local_388);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_240);
    core::Script::~Script(&local_280);
    local_310._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_298);
    core::TapBranch::~TapBranch(&local_310);
    if (local_328 != (pointer)0x0) {
      operator_delete(local_328);
    }
    if (local_340 != (pointer)0x0) {
      operator_delete(local_340);
    }
    if (local_358 != (pointer)0x0) {
      operator_delete(local_358);
    }
    if ((undefined1 *)local_388._16_8_ != local_368) {
      operator_delete((void *)local_388._16_8_);
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,(value_type *)local_1e0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&((Address *)local_1e0)->format_data_);
  core::Script::~Script(&((Address *)local_1e0)->redeem_script_);
  local_168._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             ((long)&((Address *)local_1e0)->script_tree_ + 0x78));
  core::TapBranch::~TapBranch(&(((Address *)local_1e0)->script_tree_).super_TapBranch);
  if (local_180 != (pointer)0x0) {
    operator_delete(local_180);
  }
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&((Address *)local_1e0)->address_ + 0x10U)) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_3c8.pushed_datas);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Address> TransactionJsonApi::ConvertFromLockingScript(
    const AddressFactory& factory, const Script& script,
    std::string* script_type, int64_t* require_num) {
  ExtractScriptData extract_data =
      TransactionJsonApi::ExtractLockingScript(script);
  LockingScriptType type = extract_data.script_type;
  if (script_type != nullptr) {
    std::string type_str = "nonstandard";
    if (type != LockingScriptType::kFee) {
      type_str = TransactionJsonApi::ConvertLockingScriptTypeString(type);
    }
    *script_type = type_str;
  }
  if (require_num != nullptr) {
    *require_num = static_cast<int64_t>(extract_data.pushed_datas.size());
  }

  std::vector<Address> addr_list;
  Address address;
  if (type == LockingScriptType::kMultisig) {
    if (require_num != nullptr) {
      *require_num = extract_data.req_sigs;
    }
    for (ByteData pubkey_bytes : extract_data.pushed_datas) {
      Pubkey pubkey = Pubkey(pubkey_bytes);
      address = factory.CreateP2pkhAddress(pubkey);
      addr_list.push_back(address);
    }
  } else if (type == LockingScriptType::kPayToPubkey) {
    Pubkey pubkey = Pubkey(extract_data.pushed_datas[0]);
    address = factory.CreateP2pkhAddress(pubkey);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kPayToPubkeyHash) {
    ByteData160 hash =
        ByteData160(extract_data.pushed_datas[0].GetBytes());
    address = factory.GetAddressByHash(
        AddressType::kP2pkhAddress, hash);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kPayToScriptHash) {
    ByteData160 hash =
        ByteData160(extract_data.pushed_datas[0].GetBytes());
    address = factory.GetAddressByHash(
        AddressType::kP2shAddress, hash);
    addr_list.push_back(address);
  } else if ((type == LockingScriptType::kWitnessV0KeyHash) ||
      (type == LockingScriptType::kWitnessV0ScriptHash) ||
      (type == LockingScriptType::kWitnessV1Taproot)) {
    address = factory.GetSegwitAddressByHash(
          extract_data.pushed_datas[0], extract_data.witness_version);
    addr_list.push_back(address);
  } else if (type == LockingScriptType::kWitnessUnknown) {
    try {
      address = factory.GetSegwitAddressByHash(
            extract_data.pushed_datas[0], extract_data.witness_version);
      addr_list.push_back(address);
    } catch (const CfdException&) {
      // If the data is invalid, it will not be output.
    }
  } else {
    // do nothing
  }
  return addr_list;
}